

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

void p_ere(parse *p,int stop)

{
  size_t opnd;
  int *piVar1;
  byte bVar2;
  long pos;
  size_t sVar3;
  long lVar4;
  re_guts *prVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ushort **ppuVar10;
  sop opnd_00;
  char *pcVar11;
  sop op;
  sopno start;
  char *pcVar12;
  char *pcVar13;
  long local_58;
  long local_50;
  
  bVar7 = false;
  do {
    pos = p->slen;
    pcVar13 = p->next;
    pcVar11 = p->end;
    while (pcVar13 < pcVar11) {
      start = p->slen;
      if ((*pcVar13 == 0x7c) || (*pcVar13 == stop)) goto LAB_00103e76;
      pcVar12 = (char *)((byte *)pcVar13 + 1);
      p->next = pcVar12;
      bVar2 = *pcVar13;
      switch(bVar2) {
      case 0x24:
        doemit(p,0x10000000,0);
        prVar5 = p->g;
        piVar1 = &prVar5->iflags;
        *piVar1 = *piVar1 | 2;
        piVar1 = &prVar5->neol;
        *piVar1 = *piVar1 + 1;
        break;
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x29:
      case 0x2c:
      case 0x2d:
        goto switchD_001039bd_caseD_25;
      case 0x28:
        if (pcVar11 <= pcVar12) {
          if (p->error == 0) {
            p->error = 8;
          }
          p->next = nuls;
          p->end = nuls;
        }
        sVar3 = p->g->nsub;
        opnd = sVar3 + 1;
        p->g->nsub = opnd;
        if ((long)opnd < 10) {
          p->pbegin[sVar3 + 1] = start;
        }
        doemit(p,0x34000000,opnd);
        if ((p->end <= p->next) || (*p->next != ')')) {
          p_ere(p,0x29);
        }
        if (((long)opnd < 10) && (lVar4 = p->slen, p->pend[sVar3 + 1] = lVar4, lVar4 == 0)) {
          __assert_fail("p->pend[subno] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x11f,"void p_ere_exp()");
        }
        doemit(p,0x38000000,opnd);
        pcVar13 = p->next;
        if (p->end <= pcVar13) {
LAB_00103a84:
          if (p->error == 0) {
            p->error = 8;
          }
          goto LAB_00103a93;
        }
        p->next = pcVar13 + 1;
        bVar6 = true;
        if (*pcVar13 != ')') goto LAB_00103a84;
        goto LAB_00103b84;
      case 0x2e:
        if ((p->g->cflags & 8) == 0) {
          doemit(p,0x14000000,0);
        }
        else {
          nonnewline(p);
        }
        break;
      default:
        if (bVar2 != 0x3f) {
          if (bVar2 == 0x5b) {
            p_bracket(p);
            break;
          }
          if (bVar2 == 0x5c) {
            if (pcVar11 <= pcVar12) {
              if (p->error == 0) {
                p->error = 5;
              }
              pcVar12 = nuls;
              p->end = nuls;
            }
            p->next = (char *)((byte *)pcVar12 + 1);
            bVar2 = *pcVar12;
LAB_00103b79:
            ordinary(p,(int)(char)bVar2);
            break;
          }
          if (bVar2 == 0x5e) {
            bVar6 = false;
            doemit(p,0xc000000,0);
            prVar5 = p->g;
            piVar1 = &prVar5->iflags;
            *piVar1 = *piVar1 | 1;
            piVar1 = &prVar5->nbol;
            *piVar1 = *piVar1 + 1;
            goto LAB_00103b84;
          }
          if (bVar2 == 0x7b) {
            if ((pcVar12 < pcVar11) &&
               (ppuVar10 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar10 + (long)*pcVar12 * 2 + 1) & 8) != 0)) {
              if (p->error == 0) {
                p->error = 0xd;
              }
              p->next = nuls;
              p->end = nuls;
            }
switchD_001039bd_caseD_25:
            goto LAB_00103b79;
          }
          if (bVar2 != 0x7c) goto switchD_001039bd_caseD_25;
          if (p->error == 0) {
            p->error = 0xe;
          }
          goto LAB_00103a93;
        }
      case 0x2a:
      case 0x2b:
        if (p->error == 0) {
          p->error = 0xd;
        }
LAB_00103a93:
        p->next = nuls;
        p->end = nuls;
      }
      bVar6 = true;
LAB_00103b84:
      pcVar13 = p->next;
      pcVar11 = p->end;
      if ((pcVar13 < pcVar11) &&
         (((bVar2 = *pcVar13, bVar2 - 0x2a < 2 || (bVar2 == 0x3f)) ||
          ((bVar2 == 0x7b &&
           (((byte *)pcVar13 + 1 < pcVar11 &&
            (ppuVar10 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar10 + (long)(char)((byte *)pcVar13)[1] * 2 + 1) & 8) != 0))))))))
      {
        p->next = (char *)((byte *)pcVar13 + 1);
        if (!bVar6) {
          if (p->error == 0) {
            p->error = 0xd;
          }
          p->next = nuls;
          p->end = nuls;
        }
        if (bVar2 == 0x7b) {
          iVar8 = p_count(p);
          pcVar13 = p->next;
          iVar9 = iVar8;
          if ((pcVar13 < p->end) && (*pcVar13 == ',')) {
            p->next = pcVar13 + 1;
            ppuVar10 = __ctype_b_loc();
            iVar9 = 0x100;
            if (((*(byte *)((long)*ppuVar10 + (long)pcVar13[1] * 2 + 1) & 8) != 0) &&
               (iVar9 = p_count(p), iVar9 < iVar8)) {
              if (p->error == 0) {
                p->error = 10;
              }
              p->next = nuls;
              p->end = nuls;
            }
          }
          repeat(p,start,iVar8,iVar9);
          pcVar13 = p->next;
          if ((pcVar13 < p->end) && (*pcVar13 == '}')) {
            p->next = pcVar13 + 1;
          }
          else {
            while (pcVar13 < p->end) {
              if (*pcVar13 == '}') {
                iVar9 = p->error;
                iVar8 = 10;
                goto LAB_00103e58;
              }
              pcVar13 = pcVar13 + 1;
              p->next = pcVar13;
            }
            iVar9 = p->error;
            iVar8 = 9;
LAB_00103e58:
            if (iVar9 == 0) {
              p->error = iVar8;
            }
            p->next = nuls;
            p->end = nuls;
          }
        }
        else {
          if (bVar2 == 0x2b) {
            doinsert(p,0x24000000,(p->slen - start) + 1,start);
            opnd_00 = p->slen - start;
            op = 0x28000000;
          }
          else if (bVar2 == 0x3f) {
            doinsert(p,0x3c000000,(p->slen - start) + 1,start);
            doemit(p,0x40000000,p->slen - start);
            dofwd(p,start,p->slen - start);
            doemit(p,0x44000000,0);
            if (p->error == 0) {
              p->strip[p->slen + -1] = (ulong)((uint)p->strip[p->slen + -1] & 0x7c000000) + 1;
            }
            op = 0x48000000;
            opnd_00 = 2;
          }
          else {
            if (bVar2 != 0x2a) goto LAB_00103d26;
            doinsert(p,0x24000000,(p->slen - start) + 1,start);
            doemit(p,0x28000000,p->slen - start);
            doinsert(p,0x2c000000,(p->slen - start) + 1,start);
            opnd_00 = p->slen - start;
            op = 0x30000000;
          }
          doemit(p,op,opnd_00);
        }
LAB_00103d26:
        pcVar13 = p->next;
        pcVar11 = p->end;
        if ((pcVar13 < pcVar11) &&
           (((bVar2 = *pcVar13, bVar2 - 0x2a < 2 || (bVar2 == 0x3f)) ||
            ((bVar2 == 0x7b &&
             (((byte *)pcVar13 + 1 < pcVar11 &&
              (ppuVar10 = __ctype_b_loc(),
              (*(byte *)((long)*ppuVar10 + (long)(char)((byte *)pcVar13)[1] * 2 + 1) & 8) != 0))))))
           )) {
          if (p->error == 0) {
            p->error = 0xd;
          }
          pcVar13 = nuls;
          p->next = nuls;
          p->end = nuls;
          pcVar11 = nuls;
        }
      }
    }
    start = p->slen;
LAB_00103e76:
    if (start - pos == 0) {
      if (p->error == 0) {
        p->error = 0xe;
      }
      pcVar13 = nuls;
      p->next = nuls;
      p->end = nuls;
      pcVar11 = nuls;
LAB_00103f41:
      if (bVar7) {
        dofwd(p,local_50,start - local_50);
        doemit(p,0x48000000,p->slen - local_58);
        pcVar13 = p->next;
        pcVar11 = p->end;
      }
      if ((pcVar13 < pcVar11) && (*pcVar13 != stop)) {
        __assert_fail("!MORE() || SEE(stop)",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                      ,0xfe,"void p_ere()");
      }
      return;
    }
    if ((pcVar11 <= pcVar13) || (*pcVar13 != 0x7c)) goto LAB_00103f41;
    p->next = (char *)((byte *)pcVar13 + 1);
    if (!bVar7) {
      doinsert(p,0x3c000000,(start - pos) + 1,pos);
      start = p->slen;
      local_50 = pos;
      local_58 = pos;
    }
    doemit(p,0x40000000,start - local_58);
    local_58 = p->slen + -1;
    dofwd(p,local_50,p->slen - local_50);
    local_50 = p->slen;
    doemit(p,0x44000000,0);
    bVar7 = true;
  } while( true );
}

Assistant:

static void
p_ere(p, stop)
struct parse *p;
int stop;			/* character this ERE should end at */
{
	char c;
	sopno prevback;
	sopno prevfwd;
	sopno conc;
	int first = 1;		/* is this the first alternative? */

	for (;;) {
		/* do a bunch of concatenated expressions */
		conc = HERE();
		while (MORE() && (c = PEEK()) != '|' && c != stop)
			p_ere_exp(p);
		REQUIRE(HERE() != conc, REG_EMPTY);	/* require nonempty */

		if (!EAT('|'))
			break;		/* NOTE BREAK OUT */

		if (first) {
			INSERT(OCH_, conc);	/* offset is wrong */
			prevfwd = conc;
			prevback = conc;
			first = 0;
		}
		ASTERN(OOR1, prevback);
		prevback = THERE();
		AHEAD(prevfwd);			/* fix previous offset */
		prevfwd = HERE();
		EMIT(OOR2, 0);			/* offset is very wrong */
	}

	if (!first) {		/* tail-end fixups */
		AHEAD(prevfwd);
		ASTERN(O_CH, prevback);
	}

	assert(!MORE() || SEE(stop));
}